

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckOperator.cxx
# Opt level: O2

bool __thiscall
kws::Parser::CheckOperator
          (Parser *this,uint before,uint after,unsigned_long maxSize,
          bool doNotCheckInsideParenthesis)

{
  pointer pcVar1;
  Parser *maxSize_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  char *__s;
  size_t pos;
  long lVar10;
  size_t sVar11;
  undefined7 in_register_00000081;
  string *psVar12;
  bool bVar13;
  bool local_c6;
  allocator local_c2;
  allocator local_c1;
  Parser *local_c0;
  ulong local_b8;
  uint local_ac;
  Error error;
  string local_70;
  string local_50;
  
  this->m_TestsDone[0x17] = true;
  psVar12 = this->m_TestsDescription + 0x17;
  local_c0 = (Parser *)maxSize;
  std::__cxx11::string::assign((char *)psVar12);
  __s = (char *)operator_new__(10);
  snprintf(__s,10,"%d",before);
  std::__cxx11::string::append((char *)psVar12);
  snprintf(__s,10,", after=%d",(ulong)after);
  std::__cxx11::string::append((char *)psVar12);
  operator_delete__(__s);
  maxSize_00 = local_c0;
  bVar2 = FindOperator(this,"==",before,after,(unsigned_long)local_c0,doNotCheckInsideParenthesis);
  bVar3 = FindOperator(this,"!=",before,after,(unsigned_long)maxSize_00,doNotCheckInsideParenthesis)
  ;
  bVar4 = FindOperator(this,"-=",before,after,(unsigned_long)maxSize_00,doNotCheckInsideParenthesis)
  ;
  bVar5 = FindOperator(this,"/=",before,after,(unsigned_long)maxSize_00,doNotCheckInsideParenthesis)
  ;
  bVar6 = FindOperator(this,"+=",before,after,(unsigned_long)maxSize_00,doNotCheckInsideParenthesis)
  ;
  local_b8 = (ulong)after;
  local_ac = before;
  bVar7 = FindOperator(this,"*=",before,after,(unsigned_long)maxSize_00,doNotCheckInsideParenthesis)
  ;
  psVar12 = &this->m_BufferNoComment;
  local_c0 = this;
  pos = std::__cxx11::string::find((char *)psVar12,0x162aa9);
  if ((int)CONCAT71(in_register_00000081,doNotCheckInsideParenthesis) == 0) {
LAB_00144cbc:
    lVar10 = std::__cxx11::string::find((char *)psVar12,0x162aa8);
    if (pos == lVar10 + 1U) {
LAB_00144d3d:
      bVar13 = true;
    }
    else {
      lVar10 = std::__cxx11::string::find((char *)psVar12,0x162ab4);
      if (pos == lVar10 + 1U) goto LAB_00144d3d;
      lVar10 = std::__cxx11::string::find((char *)psVar12,0x162aab);
      if (pos == lVar10 + 1U) goto LAB_00144d3d;
      lVar10 = std::__cxx11::string::find((char *)psVar12,0x162ab1);
      if (pos == lVar10 + 1U) goto LAB_00144d3d;
      lVar10 = std::__cxx11::string::find((char *)psVar12,0x162aa5);
      if (pos == lVar10 + 1U) goto LAB_00144d3d;
      lVar10 = std::__cxx11::string::find((char *)psVar12,0x162e5b);
      bVar13 = pos == lVar10 + 9U;
    }
    if (!doNotCheckInsideParenthesis) goto LAB_00144d4e;
  }
  else {
    std::__cxx11::string::string((string *)&local_70,"",&local_c1);
    bVar8 = IsBetweenCharsFast(local_c0,'(',')',pos,false,&local_70);
    bVar13 = true;
    if (!bVar8) goto LAB_00144cbc;
  }
  std::__cxx11::string::~string((string *)&local_70);
LAB_00144d4e:
  local_c6 = (!bVar7 || !bVar6) || ((!bVar5 || !bVar4) || (!bVar2 || !bVar3));
  local_b8 = (ulong)(uint)-(int)local_b8;
  while( true ) {
    if (pos == 0xffffffffffffffff) {
      return (bool)(~local_c6 & 1);
    }
    if (!bVar13) {
      pcVar1 = (psVar12->_M_dataplus)._M_p;
      uVar9 = local_ac;
      for (sVar11 = pos; (1 < (long)sVar11 && (pcVar1[sVar11 - 1] == ' ')); sVar11 = sVar11 - 1) {
        uVar9 = uVar9 - 1;
      }
      for (lVar10 = 1;
          ((long)(pos + lVar10) < (long)(local_c0->m_BufferNoComment)._M_string_length &&
          (pcVar1[lVar10 + pos] == ' ')); lVar10 = lVar10 + 1) {
      }
      if (uVar9 != 0 || (int)lVar10 + (int)local_b8 != 1) {
        error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
        error.description._M_string_length = 0;
        error.description.field_2._M_local_buf[0] = '\0';
        error.line = GetLineNumber(local_c0,pos,true);
        error.number = 0x17;
        error.line2 = error.line;
        std::__cxx11::string::assign((char *)&error.description);
        std::__cxx11::string::~string((string *)&error.description);
        local_c6 = true;
      }
    }
    pos = std::__cxx11::string::find((char *)psVar12,0x162aa9);
    if (doNotCheckInsideParenthesis) break;
LAB_00144e94:
    lVar10 = std::__cxx11::string::find((char *)psVar12,0x162aa8);
    if (pos == lVar10 + 1U) {
LAB_00144f16:
      bVar13 = true;
    }
    else {
      lVar10 = std::__cxx11::string::find((char *)psVar12,0x162ab4);
      if (pos == lVar10 + 1U) goto LAB_00144f16;
      lVar10 = std::__cxx11::string::find((char *)psVar12,0x162aab);
      if (pos == lVar10 + 1U) goto LAB_00144f16;
      lVar10 = std::__cxx11::string::find((char *)psVar12,0x162ab1);
      if (pos == lVar10 + 1U) goto LAB_00144f16;
      lVar10 = std::__cxx11::string::find((char *)psVar12,0x162aa5);
      if (pos == lVar10 + 1U) goto LAB_00144f16;
      lVar10 = std::__cxx11::string::find((char *)psVar12,0x162e5b);
      bVar13 = pos == lVar10 + 8U;
    }
    if (doNotCheckInsideParenthesis) {
LAB_00144f21:
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::__cxx11::string::string((string *)&local_50,"",&local_c2);
  bVar2 = IsBetweenCharsFast(local_c0,'(',')',pos,false,&local_50);
  bVar13 = true;
  if (!bVar2) goto LAB_00144e94;
  goto LAB_00144f21;
}

Assistant:

bool Parser::CheckOperator(unsigned int before, unsigned int after,
                           unsigned long maxSize,
                           bool doNotCheckInsideParenthesis)
{
  m_TestsDone[OPERATOR] = true;
  m_TestsDescription[OPERATOR] = "Number of spaces for the operators should be: before=";
  constexpr size_t length = 10;
  char* val = new char[length];
  snprintf(val,length,"%d",before);
  m_TestsDescription[OPERATOR] += val;  
  snprintf(val,length,", after=%d",after);
  m_TestsDescription[OPERATOR] += val;
  delete [] val;

  bool hasErrors = false;

  if(!this->FindOperator("==",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }
  
  if(!this->FindOperator("!=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  if(!this->FindOperator("-=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  if(!this->FindOperator("/=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  if(!this->FindOperator("+=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  if(!this->FindOperator("*=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  // We check the = operator but we want to make sure that it is not part
  // of the previous defined operator
  bool doNotCheck = false;
  size_t operatorPos = m_BufferNoComment.find("=",0);

  if( (doNotCheckInsideParenthesis && this->IsBetweenCharsFast('(',')',operatorPos,false)) 
    || (operatorPos == m_BufferNoComment.find("!=",0)+1)
    || (operatorPos == m_BufferNoComment.find("*=",0)+1)
    || (operatorPos == m_BufferNoComment.find("-=",0)+1)
    || (operatorPos == m_BufferNoComment.find("+=",0)+1)
    || (operatorPos == m_BufferNoComment.find("==",0)+1)
    || (operatorPos == m_BufferNoComment.find("operator",0)+9)
    )
    {
    doNotCheck = true;
    }

  while(operatorPos != std::string::npos) 
    {
    if(!doNotCheck)
      {
      // Check number of space before
      unsigned int bef = 0;
      long int i = static_cast<long int>(operatorPos)-1;
      while((i>0) && (m_BufferNoComment[i] == ' '))
        {
        bef++;
        i--;
        }

      // Check number of space after
      unsigned int aft = 0;
      i = static_cast<long int>(operatorPos)+1;
      while((i<(long int)m_BufferNoComment.size()) && (m_BufferNoComment[i] == ' '))
        {
        aft++;
        i++;
        }

      if(bef != before || aft != after)
        {
        Error error;
        error.line = this->GetLineNumber(operatorPos,true);
        error.line2 = error.line;
        error.number = OPERATOR;
        error.description = "Spaces around operator are wrong";
        //m_ErrorList.push_back(error);
        hasErrors = true;
        }
      }

    doNotCheck = false;
    size_t tmpoperatorPos = m_BufferNoComment.find("=",operatorPos+1);

    if( (doNotCheckInsideParenthesis && this->IsBetweenCharsFast('(',')',tmpoperatorPos,false)) 
    ||  (tmpoperatorPos == m_BufferNoComment.find("!=",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("*=",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("-=",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("+=",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("==",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("operator",operatorPos+1)+8)
    )
      {
      doNotCheck = true;
      }

    operatorPos = tmpoperatorPos;
      
    }
  

  return !hasErrors;
}